

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

Mio_Gate_t **
Mio_CollectRoots(Mio_Library_t *pLib,int nInputs,float tDelay,int fSkipInv,int *pnGates,int fVerbose
                )

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mio_Gate_t **ppG1;
  int local_4c;
  int fProfile;
  int iGate;
  int nGates;
  int i;
  Mio_Gate_t **ppGates;
  Mio_Gate_t *pGate;
  int fVerbose_local;
  int *pnGates_local;
  int fSkipInv_local;
  float tDelay_local;
  int nInputs_local;
  Mio_Library_t *pLib_local;
  
  iVar2 = Mio_LibraryReadGateNum(pLib);
  ppG1 = (Mio_Gate_t **)malloc((long)iVar2 << 3);
  local_4c = 0;
  iVar3 = Mio_LibraryHasProfile(pLib);
  if (iVar3 != 0) {
    printf("Mio_CollectRoots(): Using gate profile to select gates for mapping.\n");
  }
  ppGates = (Mio_Gate_t **)Mio_LibraryReadGates(pLib);
  do {
    if (ppGates == (Mio_Gate_t **)0x0) {
      if (0 < local_4c) {
        qsort(ppG1,(long)local_4c,8,Mio_DelayCompare);
        iVar2 = Mio_DelayCompare(ppG1,ppG1 + (long)local_4c + -1);
        if (0 < iVar2) {
          __assert_fail("Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/mioUtils.c"
                        ,0x230,
                        "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)"
                       );
        }
      }
      if (pnGates != (int *)0x0) {
        *pnGates = local_4c;
      }
      return ppG1;
    }
    iVar1 = local_4c;
    if (((*(int *)((long)ppGates + 0x44) <= nInputs) &&
        ((((iVar3 == 0 || (iVar4 = Mio_GateReadProfile((Mio_Gate_t *)ppGates), iVar4 != 0)) ||
          (*(int *)((long)ppGates + 0x44) < 2)) &&
         ((tDelay <= 0.0 || ((double)ppGates[10] <= (double)tDelay)))))) &&
       ((ppGates[0xd] != (Mio_Gate_t *)0x0 &&
        ((((ppGates[0xd] != (Mio_Gate_t *)0xffffffffffffffff &&
           (ppGates[0xd] != (Mio_Gate_t *)0xaaaaaaaaaaaaaaaa)) &&
          ((ppGates[0xd] != (Mio_Gate_t *)0x5555555555555555 || (fSkipInv == 0)))) &&
         (ppGates[7] == (Mio_Gate_t *)0x0)))))) {
      for (iGate = 0; iGate < local_4c; iGate = iGate + 1) {
        if ((Mio_Gate_t *)(ppG1[iGate]->field_15).uTruth == ppGates[0xd]) {
          iVar4 = Mio_CompareTwoGates(ppG1[iGate],(Mio_Gate_t *)ppGates);
          if (iVar4 != 0) {
            ppG1[iGate] = (Mio_Gate_t *)ppGates;
          }
          break;
        }
      }
      if (local_4c <= iGate) {
        if (iVar2 <= local_4c) {
          __assert_fail("iGate < nGates",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/mioUtils.c"
                        ,0x225,
                        "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)"
                       );
        }
        ppG1[local_4c] = (Mio_Gate_t *)ppGates;
        iVar1 = local_4c + 1;
        if (fVerbose != 0) {
          printf("Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n",ppGates[1],
                 (ulong)(local_4c + 2),*ppGates,ppGates[4],ppGates[2]);
        }
      }
    }
    local_4c = iVar1;
    ppGates = (Mio_Gate_t **)Mio_GateReadNext((Mio_Gate_t *)ppGates);
  } while( true );
}

Assistant:

Mio_Gate_t ** Mio_CollectRoots( Mio_Library_t * pLib, int nInputs, float tDelay, int fSkipInv, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Gate_t ** ppGates;
    int i, nGates, iGate, fProfile;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppGates = ABC_ALLOC( Mio_Gate_t *, nGates );
    iGate = 0;
    // check if profile is entered
    fProfile = Mio_LibraryHasProfile( pLib );
    if ( fProfile )
        printf( "Mio_CollectRoots(): Using gate profile to select gates for mapping.\n" );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs )
            continue;
        if ( fProfile && Mio_GateReadProfile(pGate) == 0 && pGate->nInputs > 1 )
            continue;
        if ( tDelay > 0.0 && pGate->dDelayMax > (double)tDelay )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
            continue;
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) )
            continue;
        if ( pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) && fSkipInv )
            continue;
        if ( pGate->pTwin ) // skip multi-output gates for now
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iGate; i++ )
            if ( ppGates[i]->uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwoGates(ppGates[i], pGate) )
                    ppGates[i] = pGate;
                break;
            }
        if ( i < iGate )
            continue;
        assert( iGate < nGates );
        ppGates[ iGate++ ] = pGate;
        if ( fVerbose )
            printf( "Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n", 
                iGate+1, pGate->pName, pGate->dArea, pGate->dDelayMax, pGate->pOutName, pGate->pForm );
    }
    // sort by delay
    if ( iGate > 0 ) 
    {
        qsort( (void *)ppGates, (size_t)iGate, sizeof(Mio_Gate_t *), 
                (int (*)(const void *, const void *)) Mio_DelayCompare );
        assert( Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0 );
    }
    if ( pnGates )
        *pnGates = iGate;
    return ppGates;
}